

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::ArrayJoinPromiseNodeBase
          (ArrayJoinPromiseNodeBase *this,Array<kj::Own<kj::_::PromiseNode>_> *promises,
          ExceptionOrValue *resultParts,size_t partSize)

{
  size_t sVar1;
  ulong uVar2;
  ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> builder;
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch> local_48;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006779a8;
  this->countLeft = (uint)promises->size_;
  (this->onReadyEvent).event = (Event *)0x0;
  (this->branches).ptr = (Branch *)0x0;
  (this->branches).size_ = 0;
  (this->branches).disposer = (ArrayDisposer *)0x0;
  sVar1 = promises->size_;
  builder.pos = HeapArrayDisposer::allocateUninitialized<kj::_::ArrayJoinPromiseNodeBase::Branch>
                          (sVar1);
  builder.endPtr = builder.pos + sVar1;
  builder.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  sVar1 = promises->size_;
  builder.ptr = builder.pos;
  for (uVar2 = 0; sVar1 != uVar2; uVar2 = uVar2 + 1) {
    ctor<kj::_::ArrayJoinPromiseNodeBase::Branch,kj::_::ArrayJoinPromiseNodeBase&,kj::Own<kj::_::PromiseNode>,kj::_::ExceptionOrValue&>
              (builder.pos,this,promises->ptr + (uVar2 & 0xffffffff),
               (ExceptionOrValue *)
               (&(resultParts->exception).ptr.isSet + (uVar2 & 0xffffffff) * partSize));
    builder.pos = builder.pos + 1;
  }
  local_48.size_ = ((long)builder.pos - (long)builder.ptr) / 0x48;
  local_48.ptr = builder.ptr;
  local_48.disposer = builder.disposer;
  builder.ptr = (Branch *)0x0;
  builder.pos = (RemoveConst<kj::_::ArrayJoinPromiseNodeBase::Branch> *)0x0;
  builder.endPtr = (Branch *)0x0;
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::operator=(&this->branches,&local_48);
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::~Array(&local_48);
  if ((this->branches).size_ == 0) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch>::dispose(&builder);
  return;
}

Assistant:

ArrayJoinPromiseNodeBase::ArrayJoinPromiseNodeBase(
    Array<Own<PromiseNode>> promises, ExceptionOrValue* resultParts, size_t partSize)
    : countLeft(promises.size()) {
  // Make the branches.
  auto builder = heapArrayBuilder<Branch>(promises.size());
  for (uint i: indices(promises)) {
    ExceptionOrValue& output = *reinterpret_cast<ExceptionOrValue*>(
        reinterpret_cast<byte*>(resultParts) + i * partSize);
    builder.add(*this, kj::mv(promises[i]), output);
  }
  branches = builder.finish();

  if (branches.size() == 0) {
    onReadyEvent.arm();
  }
}